

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O2

void __thiscall
pybind11::detail::loader_life_support::loader_life_support(loader_life_support *this)

{
  internals *piVar1;
  _object *local_10;
  
  piVar1 = get_internals();
  local_10 = (_object *)0x0;
  std::vector<_object*,std::allocator<_object*>>::emplace_back<_object*>
            ((vector<_object*,std::allocator<_object*>> *)&piVar1->loader_patient_stack,&local_10);
  return;
}

Assistant:

loader_life_support() {
        get_internals().loader_patient_stack.push_back(nullptr);
    }